

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

void anon_unknown.dwarf_28bf56::PulseMainloop::deviceSinkCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  anon_unknown_dwarf_28bf56 *paVar3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint __uval;
  uint __val;
  long lVar8;
  long lVar9;
  uint __len;
  long lVar10;
  anon_unknown_dwarf_28bf56 *paVar11;
  uint uVar12;
  anon_unknown_dwarf_28bf56 *paVar13;
  string newname;
  string __str;
  allocator local_99;
  pa_sink_info *local_98;
  string local_90;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar3 = DAT_0022e5a8;
  paVar13 = (anonymous_namespace)::PlaybackDevices;
  if (eol != 0) {
    std::condition_variable::notify_all();
    return;
  }
  lVar9 = (long)DAT_0022e5a8 - (long)(anonymous_namespace)::PlaybackDevices;
  if (0 < lVar9 >> 8) {
    lVar8 = (lVar9 >> 8) + 1;
    lVar10 = 0;
    do {
      iVar7 = std::__cxx11::string::compare((char *)(paVar13 + lVar10 + 0x20));
      if (iVar7 == 0) {
        paVar11 = paVar13 + lVar10;
        goto LAB_00168073;
      }
      iVar7 = std::__cxx11::string::compare((char *)(paVar13 + lVar10 + 0x60));
      if (iVar7 == 0) {
        paVar11 = paVar13 + lVar10 + 0x40;
        goto LAB_00168073;
      }
      iVar7 = std::__cxx11::string::compare((char *)(paVar13 + lVar10 + 0xa0));
      if (iVar7 == 0) {
        paVar11 = paVar13 + lVar10 + 0x80;
        goto LAB_00168073;
      }
      iVar7 = std::__cxx11::string::compare((char *)(paVar13 + lVar10 + 0xe0));
      if (iVar7 == 0) {
        paVar11 = paVar13 + lVar10 + 0xc0;
        goto LAB_00168073;
      }
      lVar8 = lVar8 + -1;
      lVar10 = lVar10 + 0x100;
    } while (1 < lVar8);
    lVar9 = lVar9 - lVar10;
    paVar13 = paVar13 + lVar10;
  }
  lVar9 = lVar9 >> 6;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      paVar11 = paVar3;
      if ((lVar9 != 3) ||
         (iVar7 = std::__cxx11::string::compare((char *)(paVar13 + 0x20)), paVar11 = paVar13,
         iVar7 == 0)) goto LAB_00168073;
      paVar13 = paVar13 + 0x40;
    }
    iVar7 = std::__cxx11::string::compare((char *)(paVar13 + 0x20));
    paVar11 = paVar13;
    if (iVar7 == 0) goto LAB_00168073;
    paVar13 = paVar13 + 0x40;
  }
  iVar7 = std::__cxx11::string::compare((char *)(paVar13 + 0x20));
  paVar11 = paVar3;
  if (iVar7 == 0) {
    paVar11 = paVar13;
  }
LAB_00168073:
  if (paVar11 == DAT_0022e5a8) {
    local_98 = info;
    std::__cxx11::string::string((string *)&local_90,info->description,(allocator *)local_70);
    bVar6 = checkName((anonymous_namespace)::PlaybackDevices,(vector<DevMap> *)DAT_0022e5a8,
                      &local_90);
    pcVar1 = local_70 + 0x10;
    if (bVar6) {
      uVar12 = 1;
      do {
        sVar4 = local_90._M_string_length;
        __s = local_98->description;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar4,(ulong)__s);
        std::__cxx11::string::append((char *)&local_90);
        __val = uVar12 + 1;
        __len = 1;
        if (8 < uVar12) {
          uVar12 = __val;
          uVar5 = 4;
          do {
            __len = uVar5;
            if (uVar12 < 100) {
              __len = __len - 2;
              goto LAB_00168157;
            }
            if (uVar12 < 1000) {
              __len = __len - 1;
              goto LAB_00168157;
            }
            if (uVar12 < 10000) goto LAB_00168157;
            bVar6 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            uVar5 = __len + 4;
          } while (bVar6);
          __len = __len + 1;
        }
LAB_00168157:
        local_70._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70._0_8_,__len,__val);
        std::__cxx11::string::_M_append((char *)&local_90,local_70._0_8_);
        if ((char *)local_70._0_8_ != pcVar1) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
        bVar6 = checkName((anonymous_namespace)::PlaybackDevices,(vector<DevMap> *)DAT_0022e5a8,
                          &local_90);
        uVar12 = __val;
      } while (bVar6);
    }
    paVar2 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar2) {
      local_70._24_8_ = local_90.field_2._8_8_;
      local_70._0_8_ = pcVar1;
    }
    else {
      local_70._0_8_ = local_90._M_dataplus._M_p;
    }
    local_70._17_7_ = local_90.field_2._M_allocated_capacity._1_7_;
    local_70[0x10] = local_90.field_2._M_local_buf[0];
    local_70._8_8_ = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::string((string *)&local_50,local_98->name,&local_99);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    emplace_back<(anonymous_namespace)::DevMap>
              ((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                *)&(anonymous_namespace)::PlaybackDevices,(DevMap *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((char *)local_70._0_8_ != pcVar1) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (2 < (int)gLogLevel) {
      _GLOBAL__N_1::PulseMainloop::deviceSinkCallbackC();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void deviceSinkCallback(pa_context*, const pa_sink_info *info, int eol) noexcept
    {
        if(eol)
        {
            mCondVar.notify_all();
            return;
        }

        /* Skip this device is if it's already in the list. */
        auto match_devname = [info](const DevMap &entry) -> bool
        { return entry.device_name == info->name; };
        if(std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(), match_devname) != PlaybackDevices.cend())
            return;

        /* Make sure the display name (description) is unique. Append a number
         * counter as needed.
         */
        int count{1};
        std::string newname{info->description};
        while(checkName(PlaybackDevices, newname))
        {
            newname = info->description;
            newname += " #";
            newname += std::to_string(++count);
        }
        PlaybackDevices.emplace_back(DevMap{std::move(newname), info->name});
        DevMap &newentry = PlaybackDevices.back();

        TRACE("Got device \"%s\", \"%s\"\n", newentry.name.c_str(), newentry.device_name.c_str());
    }